

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestGateway::export_(TestGateway *this,ExportContext context)

{
  size_t in_RCX;
  TestGateway *in_RDX;
  void *__buf;
  PromiseNode *extraout_RDX;
  int in_R8D;
  Promise<void> PVar1;
  TestGateway *local_108;
  Maybe<capnp::MessageSize> local_100;
  Request<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveParams,_capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  local_e8;
  Request<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveParams,_capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  local_b0;
  Reader local_68;
  undefined1 local_38 [8];
  Client cap;
  TestGateway *this_local;
  ExportContext context_local;
  
  cap._16_8_ = context.hook;
  this_local = in_RDX;
  context_local.hook = (CallContextHook *)this;
  CallContext<capnp::RealmGateway<capnproto_test::capnp::test::TestSturdyRef,_capnp::Text,_capnp::AnyPointer,_capnp::AnyPointer>::ExportParams,_capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>
  ::getParams(&local_68,
              (CallContext<capnp::RealmGateway<capnproto_test::capnp::test::TestSturdyRef,_capnp::Text,_capnp::AnyPointer,_capnp::AnyPointer>::ExportParams,_capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>
               *)&this_local);
  RealmGateway<capnproto_test::capnp::test::TestSturdyRef,_capnp::Text,_capnp::AnyPointer,_capnp::AnyPointer>
  ::ExportParams::Reader::getCap((Client *)local_38,&local_68);
  CallContext<capnp::RealmGateway<capnproto_test::capnp::test::TestSturdyRef,_capnp::Text,_capnp::AnyPointer,_capnp::AnyPointer>::ExportParams,_capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>
  ::releaseParams((CallContext<capnp::RealmGateway<capnproto_test::capnp::test::TestSturdyRef,_capnp::Text,_capnp::AnyPointer,_capnp::AnyPointer>::ExportParams,_capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>
                   *)&this_local);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_100,(void *)0x0);
  Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::Client::saveRequest
            (&local_e8,(Client *)local_38,&local_100);
  Request<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveParams,_capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  ::send(&local_b0,(int)&local_e8,__buf,in_RCX,in_R8D);
  local_108 = this_local;
  kj::
  Promise<capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,capnp::AnyPointer>::SaveResults>>
  ::
  then<capnp::_::(anonymous_namespace)::TestGateway::export_(capnp::CallContext<capnp::RealmGateway<capnproto_test::capnp::test::TestSturdyRef,capnp::Text,capnp::AnyPointer,capnp::AnyPointer>::ExportParams,capnp::Persistent<capnp::Text,capnp::AnyPointer>::SaveResults>)::_lambda(capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,capnp::AnyPointer>::SaveResults>)_1_,kj::_::PropagateException>
            ((Promise<capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,capnp::AnyPointer>::SaveResults>>
              *)this,(Type *)&local_b0,(PropagateException *)&local_108);
  RemotePromise<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  ::~RemotePromise((RemotePromise<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
                    *)&local_b0);
  Request<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveParams,_capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  ::~Request(&local_e8);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_100);
  Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::Client::~Client
            ((Client *)local_38);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> export_(ExportContext context) override {
    auto cap = context.getParams().getCap();
    context.releaseParams();
    return cap.saveRequest().send()
        .then([KJ_CPCAP(context)]
            (Response<Persistent<test::TestSturdyRef>::SaveResults> response) mutable {
      context.getResults().setSturdyRef(kj::str("exported-",
          response.getSturdyRef().getObjectId().getAs<Text>()));
    });
  }